

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDEntityDecl.cpp
# Opt level: O2

XSerializable * xercesc_4_0::DTDEntityDecl::createObject(MemoryManager *manager)

{
  DTDEntityDecl *this;
  
  this = (DTDEntityDecl *)XMemory::operator_new(0x60,manager);
  DTDEntityDecl(this,manager);
  return (XSerializable *)this;
}

Assistant:

void DTDEntityDecl::serialize(XSerializeEngine& serEng)
{
    XMLEntityDecl::serialize(serEng);

    if (serEng.isStoring())
    {
        serEng<<fDeclaredInIntSubset;
        serEng<<fIsParameter;
        serEng<<fIsSpecialChar;
    }
    else
    {
        serEng>>fDeclaredInIntSubset;
        serEng>>fIsParameter;
        serEng>>fIsSpecialChar;
    }
}